

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<unsigned_char,_int,_duckdb::ParquetCastOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<unsigned_char,_int,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  ValidityMask *this_00;
  byte bVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  uint uVar4;
  Allocator *pAVar5;
  InternalException *this_01;
  idx_t r;
  WriteStream *ser;
  NumericStatisticsState<unsigned_char,_int,_duckdb::BaseParquetOperator> *numeric_stats;
  allocator local_59;
  int target_value;
  StandardColumnWriter<unsigned_char,_int,_duckdb::ParquetCastOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01e057fe_caseD_1:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&target_value,"Unknown encoding",&local_59);
    InternalException::InternalException(this_01,(string *)&target_value);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = &input_column->validity;
  pdVar2 = input_column->data;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0)
    {
      TemplatedWritePlain<unsigned_char,int,duckdb::ParquetCastOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<unsigned_char,int,duckdb::ParquetCastOperator,false>
              (input_column,stats,chunk_start,chunk_end,this_00,temp_writer);
    return;
  default:
    goto switchD_01e057fe_caseD_1;
  case 5:
    if (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar3) {
          bVar1 = pdVar2[chunk_start];
          target_value = (int)bVar1;
          uVar4 = (uint)bVar1;
          if ((int)uVar4 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar4;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar4) {
            *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)bVar1;
          }
          DbpEncoder::BeginWrite<int>((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = chunk_start + 1;
          break;
        }
      }
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      bVar1 = pdVar2[chunk_start];
      target_value = (int)bVar1;
      uVar4 = (uint)bVar1;
      if ((int)uVar4 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
        *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar4;
      }
      if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar4) {
        *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)bVar1;
      }
      DbpEncoder::WriteValue<int>((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
    }
    break;
  case 6:
    if (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar3) {
          bVar1 = pdVar2[chunk_start];
          target_value = (int)bVar1;
          uVar4 = (uint)bVar1;
          if ((int)uVar4 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar4;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar4) {
            *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)bVar1;
          }
          pAVar5 = BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<int>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar5,temp_writer,&target_value);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = chunk_start + 1;
          break;
        }
      }
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      bVar1 = pdVar2[chunk_start];
      target_value = (int)bVar1;
      uVar4 = (uint)bVar1;
      if ((int)uVar4 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
        *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar4;
      }
      if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar4) {
        *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)bVar1;
      }
      DlbaEncoder::WriteValue<int>((DlbaEncoder *)(page_state_p + 0x909),temp_writer,&target_value);
    }
    break;
  case 8:
    if (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0') {
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar3) {
          target_value = CONCAT31(target_value._1_3_,
                                  *(undefined1 *)
                                   ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
          (**temp_writer->_vptr_WriteStream)(temp_writer,&target_value,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
      }
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      target_value = PrimitiveDictionary<unsigned_char,_int,_duckdb::ParquetCastOperator>::GetIndex
                               ((PrimitiveDictionary<unsigned_char,_int,_duckdb::ParquetCastOperator>
                                 *)page_state_p[0x121b]._vptr_ColumnWriterPageState,
                                pdVar2 + chunk_start);
      RleBpEncoder::WriteValue
                ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&target_value);
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar5 = BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar5);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      bVar1 = pdVar2[chunk_start];
      target_value = (int)bVar1;
      uVar4 = (uint)bVar1;
      if ((int)uVar4 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
        *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar4;
      }
      if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar4) {
        *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)bVar1;
      }
      BssEncoder::WriteValue<int>((BssEncoder *)(page_state_p + 0x1215),&target_value);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}